

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::R_formatter<spdlog::details::null_scoped_padder>::format
          (R_formatter<spdlog::details::null_scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  uint uVar1;
  byte bVar2;
  size_t sVar3;
  ulong uVar4;
  basic_string_view<char> fmt;
  basic_string_view<char> fmt_00;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args_00;
  ulong local_58 [2];
  buffer<char> local_48;
  memory_buf_t *local_28;
  
  uVar1 = tm_time->tm_hour;
  if ((ulong)uVar1 < 100) {
    bVar2 = (byte)((uVar1 & 0xff) / 10);
    sVar3 = (dest->super_buffer<char>).size_;
    uVar4 = sVar3 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar4) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar3 = (dest->super_buffer<char>).size_;
      uVar4 = sVar3 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar4;
    (dest->super_buffer<char>).ptr_[sVar3] = bVar2 | 0x30;
    sVar3 = (dest->super_buffer<char>).size_;
    uVar4 = sVar3 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar4) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar3 = (dest->super_buffer<char>).size_;
      uVar4 = sVar3 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar4;
    (dest->super_buffer<char>).ptr_[sVar3] = (char)uVar1 + bVar2 * -10 | 0x30;
  }
  else {
    local_48.size_ = (dest->super_buffer<char>).size_;
    local_48._vptr_buffer = (_func_int **)&PTR_grow_0014d3a0;
    fmt.size_ = 5;
    fmt.data_ = "{:02}";
    args.field_1.values_ =
         (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_58;
    args.desc_ = 1;
    local_58[0] = (ulong)uVar1;
    local_48.capacity_ = local_48.size_;
    local_28 = dest;
    ::fmt::v9::detail::vformat_to<char>(&local_48,fmt,args,(locale_ref)0x0);
  }
  sVar3 = (dest->super_buffer<char>).size_;
  uVar4 = sVar3 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar4) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    sVar3 = (dest->super_buffer<char>).size_;
    uVar4 = sVar3 + 1;
  }
  (dest->super_buffer<char>).size_ = uVar4;
  (dest->super_buffer<char>).ptr_[sVar3] = ':';
  uVar1 = tm_time->tm_min;
  if ((ulong)uVar1 < 100) {
    bVar2 = (byte)((uVar1 & 0xff) / 10);
    sVar3 = (dest->super_buffer<char>).size_;
    uVar4 = sVar3 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar4) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar3 = (dest->super_buffer<char>).size_;
      uVar4 = sVar3 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar4;
    (dest->super_buffer<char>).ptr_[sVar3] = bVar2 | 0x30;
    sVar3 = (dest->super_buffer<char>).size_;
    uVar4 = sVar3 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar4) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar3 = (dest->super_buffer<char>).size_;
      uVar4 = sVar3 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar4;
    (dest->super_buffer<char>).ptr_[sVar3] = (char)uVar1 + bVar2 * -10 | 0x30;
  }
  else {
    local_48.size_ = (dest->super_buffer<char>).size_;
    local_48._vptr_buffer = (_func_int **)&PTR_grow_0014d3a0;
    fmt_00.size_ = 5;
    fmt_00.data_ = "{:02}";
    args_00.field_1.values_ =
         (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_58;
    args_00.desc_ = 1;
    local_58[0] = (ulong)uVar1;
    local_48.capacity_ = local_48.size_;
    local_28 = dest;
    ::fmt::v9::detail::vformat_to<char>(&local_48,fmt_00,args_00,(locale_ref)0x0);
  }
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override {
        const size_t field_size = 5;
        ScopedPadder p(field_size, padinfo_, dest);

        fmt_helper::pad2(tm_time.tm_hour, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_min, dest);
    }